

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitSequenceNode(MethodSemanticAnalysis *this,SequenceNode *node)

{
  pointer ppLVar1;
  pointer ppNVar2;
  element_type *peVar3;
  LocalDeclarations *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
  *pvVar4;
  Oop localContext;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 location;
  LocalScope *this_02;
  anon_union_8_4_0eb573b0_for_Oop_0 symbol;
  Node **child;
  pointer ppLVar6;
  pointer ppNVar7;
  TemporalVariableLookupPtr res;
  _func_int **local_50;
  element_type *local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = AST::SequenceNode::getLocalDeclarations(node);
  if (this_00 != (LocalDeclarations *)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    this_01->_M_use_count = 1;
    this_01->_M_weak_count = 1;
    this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164d68;
    symbol.pointer = (uint8_t *)(this_01 + 1);
    LocalScope::LocalScope((LocalScope *)symbol,&(this->super_ScopedInterpreter).currentScope);
    pvVar4 = AST::LocalDeclarations::getLocals(this_00);
    ppLVar6 = (pvVar4->
              super__Vector_base<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppLVar1 = (pvVar4->
              super__Vector_base<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar6 != ppLVar1) {
      do {
        localContext = AST::LocalDeclaration::getSymbolOop(*ppLVar6);
        location.pointer = symbol.pointer;
        this_02 = (LocalScope *)&local_50;
        LocalScope::addArgument((LocalScope *)&local_50,(Oop)symbol,(Node *)localContext.field_0);
        if (local_50 == (_func_int **)0x0) {
          AbstractASTVisitor::error
                    ((AbstractASTVisitor *)this_02,(Node *)location.header,
                     "the argument has the same name as another argument.");
        }
        std::
        vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
        ::push_back(&this->localVariables,(value_type *)&local_50);
        if (local_48 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
        }
        ppLVar6 = ppLVar6 + 1;
      } while (ppLVar6 != ppLVar1);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    (this->super_ScopedInterpreter).currentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)symbol;
    local_40.pointer = symbol.pointer;
    local_38._M_pi = this_01;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->super_ScopedInterpreter).currentScope.
                super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&local_38);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  pvVar5 = AST::SequenceNode::getChildren(node);
  ppNVar2 = (pvVar5->super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar7 = (pvVar5->
                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppNVar7 != ppNVar2; ppNVar7 = ppNVar7 + 1
      ) {
    (*(*ppNVar7)->_vptr_Node[2])(*ppNVar7,this);
  }
  if (this_00 != (LocalDeclarations *)0x0) {
    peVar3 = (this->super_ScopedInterpreter).currentScope.
             super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_ScopedInterpreter).currentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar3->parentScope).
         super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->super_ScopedInterpreter).currentScope.
                super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&(peVar3->parentScope).
                 super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodSemanticAnalysis::visitSequenceNode(SequenceNode *node)
{
    auto decls = node->getLocalDeclarations();
    if(decls)
	{
        auto newScope = std::make_shared<LocalScope> (currentScope);
        for(auto &localDecl : decls->getLocals())
        {
            auto res = newScope->addArgument(localDecl->getSymbolOop(), localContext);
			if(!res)
				error(localDecl, "the argument has the same name as another argument.");
            localVariables.push_back(res);
        }

        pushScope(newScope);
	}

	for(auto &child : node->getChildren())
		child->acceptVisitor(this);

    if(decls)
        popScope();

    return Oop();
}